

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraphBuilder.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* buildLabelMap_abi_cxx11_
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *__return_storage_ptr__,AssemblyCommands *commands)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer psVar3;
  LabelCommand *this;
  mapped_type *pmVar4;
  long lVar5;
  ulong uVar6;
  string local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar3 = (commands->
           super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((commands->
      super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      lVar2 = *(long *)((long)&(psVar3->
                               super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar5);
      if (lVar2 == 0) {
        this = (LabelCommand *)0x0;
      }
      else {
        this = (LabelCommand *)
               __dynamic_cast(lVar2,&AssemblyCode::AssemblyCommand::typeinfo,
                              &AssemblyCode::LabelCommand::typeinfo,0);
      }
      if (this != (LabelCommand *)0x0) {
        AssemblyCode::LabelCommand::getLabel_abi_cxx11_(&local_50,this);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](__return_storage_ptr__,&local_50);
        *pmVar4 = (mapped_type)uVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      uVar6 = uVar6 + 1;
      psVar3 = (commands->
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(commands->
                                   super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, int> buildLabelMap(const AssemblyCommands &commands) {
    std::map<std::string, int> map;
    for (int i = 0; i < commands.size(); ++i) {
        const AssemblyCode::LabelCommand* labelCommand =
                dynamic_cast<const AssemblyCode::LabelCommand*>(commands[i].get());

        if (labelCommand != nullptr) {
            map[labelCommand->getLabel()] = i;
        }
    }

    return map;
}